

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int bio_bytein(opj_bio_t *bio)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  opj_bio_t *bio_local;
  uint local_4;
  
  bio->buf = (bio->buf & 0xff) << 8;
  iVar2 = 8;
  if (bio->buf == 0xff00) {
    iVar2 = 7;
  }
  bio->ct = iVar2;
  bVar3 = bio->bp < bio->end;
  if (bVar3) {
    pbVar1 = bio->bp;
    bio->bp = pbVar1 + 1;
    bio->buf = (uint)*pbVar1 | bio->buf;
  }
  local_4 = (uint)!bVar3;
  return local_4;
}

Assistant:

static int bio_bytein(opj_bio_t *bio) {
	bio->buf = (bio->buf << 8) & 0xffff;
	bio->ct = bio->buf == 0xff00 ? 7 : 8;
	if (bio->bp >= bio->end) {
		return 1;
	}
	bio->buf |= *bio->bp++;
	return 0;
}